

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

void __thiscall write_node_v10::operator()(write_node_v10 *this,ai_node *node,xr_writer *w)

{
  xr_writer *w_local;
  ai_node *node_local;
  write_node_v10 *this_local;
  
  xray_re::xr_writer::w_cseq<unsigned_char>(w,0xc,node->data);
  xray_re::xr_writer::w_u16(w,node->cover);
  xray_re::xr_writer::w_u16(w,node->low_cover);
  xray_re::xr_writer::w_u16(w,node->plane);
  xray_re::xr_writer::w_u24(w,node->packed_xz);
  xray_re::xr_writer::w_u16(w,node->packed_y);
  return;
}

Assistant:

void operator()(const ai_node& node, xr_writer& w) const {
	w.w_cseq(12, node.data);
	w.w_u16(node.cover);
	w.w_u16(node.low_cover);
	w.w_u16(node.plane);
	w.w_u24(node.packed_xz);
	w.w_u16(node.packed_y);
}